

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_18::Poppifier::emitDrop(Poppifier *this,Drop *curr)

{
  bool bVar1;
  reference pvVar2;
  reference pTVar3;
  Expression *value;
  Drop *local_60;
  uintptr_t local_58;
  Drop *local_50;
  undefined1 local_48 [8];
  reverse_iterator<wasm::Type::Iterator> end;
  reverse_iterator<wasm::Type::Iterator> it;
  Type types;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *instrs;
  Drop *curr_local;
  Poppifier *this_local;
  
  pvVar2 = std::
           vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
           ::back(&this->scopeStack);
  bVar1 = wasm::Type::isTuple(&curr->value->type);
  if (bVar1) {
    wasm::Type::rbegin((Type *)&end.current.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                index);
    wasm::Type::rend((Type *)local_48);
    while (bVar1 = std::operator!=((reverse_iterator<wasm::Type::Iterator> *)
                                   &end.current.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                    .index,(reverse_iterator<wasm::Type::Iterator> *)local_48),
          bVar1) {
      pTVar3 = std::reverse_iterator<wasm::Type::Iterator>::operator*
                         ((reverse_iterator<wasm::Type::Iterator> *)
                          &end.current.
                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                         );
      local_58 = pTVar3->id;
      value = (Expression *)Builder::makePop(&this->builder,(Type)local_58);
      local_50 = Builder::makeDrop(&this->builder,value);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (&pvVar2->instrs,(value_type *)&local_50);
      std::reverse_iterator<wasm::Type::Iterator>::operator++
                ((reverse_iterator<wasm::Type::Iterator> *)
                 &end.current.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                  index);
    }
  }
  else {
    poppify(this,(Expression *)curr);
    local_60 = curr;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (&pvVar2->instrs,(value_type *)&local_60);
  }
  return;
}

Assistant:

void Poppifier::emitDrop(Drop* curr) {
  auto& instrs = scopeStack.back().instrs;
  if (curr->value->type.isTuple()) {
    // Drop each element individually
    auto types = curr->value->type;
    for (auto it = types.rbegin(), end = types.rend(); it != end; ++it) {
      instrs.push_back(builder.makeDrop(builder.makePop(*it)));
    }
  } else {
    poppify(curr);
    instrs.push_back(curr);
  }
}